

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

void __thiscall CVerifyDB::~CVerifyDB(CVerifyDB *this)

{
  long in_FS_OFFSET;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = 0;
  local_48 = 0;
  local_30 = 0;
  local_28 = 0;
  local_58 = &local_48;
  local_38 = &local_28;
  (*this->m_notifications->_vptr_Notifications[4])(this->m_notifications,&local_58,100,0);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CVerifyDB::~CVerifyDB()
{
    m_notifications.progress(bilingual_str{}, 100, false);
}